

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_object.cpp
# Opt level: O0

void __thiscall
mjs::string_object::do_debug_print_extra
          (string_object *this,wostream *os,int param_2,int param_3,int indent)

{
  wostream *pwVar1;
  wstring_view local_90;
  wstring local_80;
  allocator<wchar_t> local_49;
  wstring local_48 [36];
  int local_24;
  int local_20;
  int indent_local;
  int param_3_local;
  int param_2_local;
  wostream *os_local;
  string_object *this_local;
  
  local_24 = indent;
  local_20 = param_3;
  indent_local = param_2;
  _param_3_local = os;
  os_local = (wostream *)this;
  std::allocator<wchar_t>::allocator();
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>(local_48,(long)indent,L' ',&local_49);
  pwVar1 = std::operator<<(os,local_48);
  pwVar1 = std::operator<<(pwVar1,"[[Value]]: \"");
  local_90 = view(this);
  cpp_quote_abi_cxx11_(&local_80,(mjs *)&local_90,(wstring_view *)local_90._M_str);
  pwVar1 = std::operator<<(pwVar1,(wstring *)&local_80);
  std::operator<<(pwVar1,"\"\n");
  std::__cxx11::wstring::~wstring((wstring *)&local_80);
  std::__cxx11::wstring::~wstring(local_48);
  std::allocator<wchar_t>::~allocator(&local_49);
  return;
}

Assistant:

void do_debug_print_extra(std::wostream& os, int, int, int indent) const override {
        os << std::wstring(indent, ' ') << "[[Value]]: \"" << cpp_quote(view()) << "\"\n";
    }